

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall (anonymous_namespace)::ResizeCspTest::EndPassHook(ResizeCspTest *this)

{
  anon_unknown.dwarf_ccb0f7::ResizeCspTest::EndPassHook((ResizeCspTest *)(this + -0x18));
  return;
}

Assistant:

void EndPassHook() override {
#if WRITE_COMPRESSED_STREAM
    if (outfile_) {
      if (!fseek(outfile_, 0, SEEK_SET))
        write_ivf_file_header(&cfg_, out_frames_, outfile_);
      fclose(outfile_);
      outfile_ = nullptr;
    }
#endif
  }